

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O3

void * delete(hash_table_t *h,uint32 hash,char *key,size_t len)

{
  hash_entry_s **pphVar1;
  void *pvVar2;
  hash_entry_s *phVar3;
  int32 iVar4;
  size_t sVar5;
  hash_entry_t *phVar6;
  hash_entry_t *ptr;
  hash_entry_t *entry;
  
  if (h->table[hash].key == (char *)0x0) {
    return (void *)0x0;
  }
  entry = h->table + hash;
  if (h->nocase == 0) {
    phVar6 = (hash_entry_t *)0x0;
    do {
      if (entry->len == len) {
        if (len == 0) goto LAB_0010c279;
        sVar5 = 0;
        while (entry->key[sVar5] == key[sVar5]) {
          sVar5 = sVar5 + 1;
          if (len == sVar5) goto LAB_0010c279;
        }
      }
      pphVar1 = &entry->next;
      phVar6 = entry;
      entry = *pphVar1;
      if (*pphVar1 == (hash_entry_s *)0x0) {
        return (void *)0x0;
      }
    } while( true );
  }
  phVar6 = (hash_entry_t *)0x0;
  while ((entry->len != len || (iVar4 = keycmp_nocase(entry,key), iVar4 != 0))) {
    pphVar1 = &entry->next;
    phVar6 = entry;
    entry = *pphVar1;
    if (*pphVar1 == (hash_entry_s *)0x0) {
      return (void *)0x0;
    }
  }
LAB_0010c279:
  pvVar2 = entry->val;
  ptr = entry->next;
  if (phVar6 == (hash_entry_t *)0x0) {
    if (ptr == (hash_entry_t *)0x0) {
      entry->key = (char *)0x0;
      entry->len = 0;
      goto LAB_0010c2b0;
    }
    entry->key = ptr->key;
    entry->len = ptr->len;
    phVar3 = ptr->next;
    entry->val = ptr->val;
    entry->next = phVar3;
  }
  else {
    phVar6->next = ptr;
    ptr = entry;
  }
  ckd_free(ptr);
LAB_0010c2b0:
  h->inuse = h->inuse + -1;
  return pvVar2;
}

Assistant:

static void *
delete(hash_table_t * h, uint32 hash, const char *key, size_t len)
{
    hash_entry_t *entry, *prev;
    void *val;

    prev = NULL;
    entry = &(h->table[hash]);
    if (entry->key == NULL)
        return NULL;

    if (h->nocase) {
        while (entry && ((entry->len != len)
                         || (keycmp_nocase(entry, key) != 0))) {
            prev = entry;
            entry = entry->next;
        }
    }
    else {
        while (entry && ((entry->len != len)
                         || (keycmp_case(entry, key) != 0))) {
            prev = entry;
            entry = entry->next;
        }
    }

    if (entry == NULL)
        return NULL;

    /* At this point, entry will be the one required to be deleted, prev
       will contain the previous entry
     */
    val = entry->val;

    if (prev == NULL) {
        /* That is to say the entry in the hash table (not the chain) matched the key. */
        /* We will then copy the things from the next entry to the hash table */
        prev = entry;
        if (entry->next) {      /* There is a next entry, great, copy it. */
            entry = entry->next;
            prev->key = entry->key;
            prev->len = entry->len;
            prev->val = entry->val;
            prev->next = entry->next;
            ckd_free(entry);
        }
        else {                  /* There is not a next entry, just set the key to null */
            prev->key = NULL;
            prev->len = 0;
            prev->next = NULL;
        }

    }
    else {                      /* This case is simple */
        prev->next = entry->next;
        ckd_free(entry);
    }

    /* Do wiring and free the entry */

    --h->inuse;

    return val;
}